

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O0

int32_t ra_get_index(roaring_array_t *ra,uint16_t x)

{
  uint16_t in_SI;
  int *in_RDI;
  int local_4;
  
  if ((*in_RDI == 0) || (*(uint16_t *)(*(long *)(in_RDI + 4) + (long)(*in_RDI + -1) * 2) == in_SI))
  {
    local_4 = *in_RDI + -1;
  }
  else {
    local_4 = binarySearch(*(uint16_t **)(in_RDI + 4),*in_RDI,in_SI);
  }
  return local_4;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}